

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O0

JsonRpcException * __thiscall
jsonrpccxx::Dispatcher::process_type_error
          (JsonRpcException *__return_storage_ptr__,Dispatcher *this,string *name,
          JsonRpcException *e)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  json *pjVar4;
  string *__lhs;
  mapped_type *this_00;
  reference __rhs;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Self local_68 [3];
  _Self local_50;
  undefined1 local_48 [8];
  string message;
  JsonRpcException *e_local;
  string *name_local;
  Dispatcher *this_local;
  
  message.field_2._8_8_ = e;
  iVar2 = JsonRpcException::Code(e);
  if (iVar2 == -0x7f5a) {
    pjVar4 = JsonRpcException::Data_abi_cxx11_((JsonRpcException *)message.field_2._8_8_);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::empty(pjVar4);
    if (!bVar1) {
      __lhs = JsonRpcException::Message_abi_cxx11_((JsonRpcException *)message.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     __lhs," for parameter ");
      local_50._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find(&this->mapping,name);
      local_68[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end(&this->mapping);
      bVar1 = std::operator!=(&local_50,local_68);
      if (bVar1) {
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&this->mapping,name);
        pjVar4 = JsonRpcException::Data_abi_cxx11_((JsonRpcException *)message.field_2._8_8_);
        uVar3 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::get<unsigned_int,unsigned_int>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pjVar4);
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](this_00,(ulong)uVar3);
        std::operator+(&local_a8,"\"",__rhs);
        std::operator+(&local_88,&local_a8,"\"");
        std::__cxx11::string::operator+=((string *)local_48,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      else {
        pjVar4 = JsonRpcException::Data_abi_cxx11_((JsonRpcException *)message.field_2._8_8_);
        uVar3 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::get<unsigned_int,unsigned_int>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pjVar4);
        std::__cxx11::to_string(&local_c8,uVar3);
        std::__cxx11::string::operator+=((string *)local_48,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      iVar2 = JsonRpcException::Code((JsonRpcException *)message.field_2._8_8_);
      JsonRpcException::JsonRpcException(__return_storage_ptr__,iVar2,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
      return __return_storage_ptr__;
    }
  }
  JsonRpcException::JsonRpcException
            (__return_storage_ptr__,(JsonRpcException *)message.field_2._8_8_);
  return __return_storage_ptr__;
}

Assistant:

JsonRpcException process_type_error(const std::string &name, JsonRpcException &e) {
      if (e.Code() == -32602 && !e.Data().empty()) {
        std::string message = e.Message() + " for parameter ";
        if (this->mapping.find(name) != this->mapping.end()) {
          message += "\"" + mapping[name][e.Data().get<unsigned int>()] + "\"";
        } else {
          message += std::to_string(e.Data().get<unsigned int>());
        }
        return JsonRpcException(e.Code(), message);
      }
      return e;
    }